

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O3

NodeRecord * __thiscall
embree::avx::CreateMortonLeaf<8,_embree::InstanceArrayPrimitive>::operator()
          (NodeRecord *__return_storage_ptr__,
          CreateMortonLeaf<8,_embree::InstanceArrayPrimitive> *this,range<unsigned_int> *current,
          CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  uint uVar3;
  uint uVar4;
  RTCFormat RVar5;
  uint uVar6;
  FastAllocator *this_00;
  ThreadLocal *pTVar7;
  ThreadLocal2 *this_01;
  iterator __position;
  InstanceArray *pIVar8;
  RawBufferView *pRVar9;
  char *pcVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  size_t sVar16;
  ulong uVar17;
  long lVar18;
  Accel *pAVar19;
  long lVar20;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar21;
  undefined1 auVar22 [32];
  float fVar23;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar24 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar40;
  float fVar41;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar42;
  float fVar43;
  float fVar46;
  float fVar47;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar50 [16];
  undefined1 in_ZMM7 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar57;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar58 [16];
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 in_ZMM11 [64];
  undefined1 auVar70 [16];
  undefined1 in_ZMM12 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined8 *local_d8;
  undefined8 *local_d0;
  undefined1 local_c8;
  ThreadLocal2 *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  ThreadLocal2 *local_98;
  char local_90;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  
  auVar74 = in_ZMM12._0_16_;
  auVar70 = in_ZMM11._0_16_;
  auVar56 = in_ZMM7._0_16_;
  auVar50 = in_ZMM6._0_16_;
  local_f8._8_8_ = local_f8._0_8_;
  local_f8._0_8_ = __return_storage_ptr__;
  uVar3 = current->_begin;
  uVar4 = current->_end;
  uVar13 = CONCAT44(0,uVar4 - uVar3);
  local_108._8_8_ = local_108._0_8_;
  local_108._0_8_ = uVar13;
  local_d8 = (undefined8 *)(uVar13 * 8);
  this_00 = alloc->alloc;
  pTVar7 = alloc->talloc1;
  this_01 = pTVar7->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_90 = '\x01';
    local_98 = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar22 = ZEXT1632(ZEXT816(0) << 0x40);
    (this_01->alloc0).end = auVar22._0_8_;
    (this_01->alloc0).allocBlockSize = auVar22._8_8_;
    (this_01->alloc0).bytesUsed = auVar22._16_8_;
    (this_01->alloc0).bytesWasted = auVar22._24_8_;
    (this_01->alloc0).ptr = (char *)auVar22._0_8_;
    (this_01->alloc0).cur = auVar22._8_8_;
    (this_01->alloc0).end = auVar22._16_8_;
    (this_01->alloc0).allocBlockSize = auVar22._24_8_;
    auVar22 = ZEXT1632(ZEXT816(0) << 0x40);
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).end = auVar22._0_8_;
      (this_01->alloc1).allocBlockSize = auVar22._8_8_;
      (this_01->alloc1).bytesUsed = auVar22._16_8_;
      (this_01->alloc1).bytesWasted = auVar22._24_8_;
      (this_01->alloc1).ptr = (char *)auVar22._0_8_;
      (this_01->alloc1).cur = auVar22._8_8_;
      (this_01->alloc1).end = auVar22._16_8_;
      (this_01->alloc1).allocBlockSize = auVar22._24_8_;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)auVar22._0_8_;
      (this_01->alloc1).cur = auVar22._8_8_;
      (this_01->alloc1).end = auVar22._16_8_;
      (this_01->alloc1).allocBlockSize = auVar22._24_8_;
      (this_01->alloc1).end = auVar22._0_8_;
      (this_01->alloc1).allocBlockSize = auVar22._8_8_;
      (this_01->alloc1).bytesUsed = auVar22._16_8_;
      (this_01->alloc1).bytesWasted = auVar22._24_8_;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_d0 = &FastAllocator::s_thread_local_allocators_lock;
    local_c8 = 1;
    in_ZMM6 = ZEXT1664(auVar50);
    in_ZMM7 = ZEXT1664(auVar56);
    in_ZMM11 = ZEXT1664(auVar70);
    in_ZMM12 = ZEXT1664(auVar74);
    local_c0 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,&local_c0);
    }
    else {
      *__position._M_current = local_c0;
      pppTVar2 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (local_90 == '\x01') {
      MutexSys::unlock(&local_98->mutex);
    }
  }
  puVar12 = local_d8;
  pTVar7->bytesUsed = pTVar7->bytesUsed + (long)local_d8;
  sVar16 = pTVar7->cur;
  uVar17 = (ulong)(-(int)sVar16 & 0xf);
  uVar14 = (long)local_d8 + uVar17 + sVar16;
  pTVar7->cur = uVar14;
  if (pTVar7->end < uVar14) {
    pTVar7->cur = sVar16;
    puVar11 = (undefined8 *)pTVar7->allocBlockSize;
    if ((undefined8 *)((long)local_d8 * 4) < puVar11 || (long)local_d8 * 4 - (long)puVar11 == 0) {
      local_d0 = puVar11;
      pcVar15 = (char *)FastAllocator::malloc(this_00,(size_t)&local_d0);
      pTVar7->ptr = pcVar15;
      sVar16 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
      pTVar7->bytesWasted = sVar16;
      pTVar7->end = (size_t)local_d0;
      pTVar7->cur = (size_t)puVar12;
      if (local_d0 < puVar12) {
        pTVar7->cur = 0;
        local_d0 = (undefined8 *)pTVar7->allocBlockSize;
        pcVar15 = (char *)FastAllocator::malloc(this_00,(size_t)&local_d0);
        pTVar7->ptr = pcVar15;
        sVar16 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
        pTVar7->bytesWasted = sVar16;
        pTVar7->end = (size_t)local_d0;
        pTVar7->cur = (size_t)puVar12;
        if (local_d0 < puVar12) {
          pTVar7->cur = 0;
          pcVar15 = (char *)0x0;
          goto LAB_0149ec7c;
        }
      }
      pTVar7->bytesWasted = sVar16;
    }
    else {
      pcVar15 = (char *)FastAllocator::malloc(this_00,(size_t)&local_d8);
    }
  }
  else {
    pTVar7->bytesWasted = pTVar7->bytesWasted + uVar17;
    pcVar15 = pTVar7->ptr + (uVar14 - (long)local_d8);
  }
LAB_0149ec7c:
  if (uVar4 == uVar3) {
    aVar21.m128[2] = INFINITY;
    aVar21._0_8_ = 0x7f8000007f800000;
    aVar21.m128[3] = INFINITY;
    aVar28.m128[2] = -INFINITY;
    aVar28._0_8_ = 0xff800000ff800000;
    aVar28.m128[3] = -INFINITY;
  }
  else {
    pIVar8 = this->mesh;
    aVar28.m128[2] = -INFINITY;
    aVar28._0_8_ = 0xff800000ff800000;
    aVar28.m128[3] = -INFINITY;
    aVar21.m128[2] = INFINITY;
    aVar21._0_8_ = 0x7f8000007f800000;
    aVar21.m128[3] = INFINITY;
    lVar18 = 0;
    do {
      uVar4 = this->morton[(ulong)uVar3 + lVar18].field_0.field_0.index;
      uVar14 = (ulong)uVar4;
      pAVar19 = *(Accel **)&(pIVar8->super_Geometry).field_0x58;
      auVar50 = in_ZMM7._0_16_;
      if ((pAVar19 != (Accel *)0x0) ||
         (*(int *)((pIVar8->object_ids).super_RawBufferView.ptr_ofs +
                  (pIVar8->object_ids).super_RawBufferView.stride * uVar14) != -1)) {
        pRVar9 = (pIVar8->l2w_buf).items;
        RVar5 = pRVar9->format;
        if ((pIVar8->super_Geometry).field_8.field_0x1 == '\x01') {
          if ((int)RVar5 < 0x9244) {
            if (RVar5 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar10 = pRVar9->ptr_ofs;
              lVar20 = pRVar9->stride * uVar14;
              auVar50 = vinsertps_avx(ZEXT416(*(uint *)(pcVar10 + lVar20)),
                                      ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x10)),0x1c);
              local_a8 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x20)),0x28);
              auVar50 = vinsertps_avx(ZEXT416(*(uint *)(pcVar10 + lVar20 + 4)),
                                      ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x14)),0x1c);
              local_78 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x24)),0x28);
              auVar50 = vinsertps_avx(ZEXT416(*(uint *)(pcVar10 + lVar20 + 8)),
                                      ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x18)),0x1c);
              local_b8 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x28)),0x28);
              auVar50 = vinsertps_avx(ZEXT416(*(uint *)(pcVar10 + lVar20 + 0xc)),
                                      ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x1c)),0x1c);
              local_68 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x2c)),0x28);
            }
            else if (RVar5 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar10 = pRVar9->ptr_ofs;
              lVar20 = pRVar9->stride * uVar14;
              auVar52._8_8_ = 0;
              auVar52._0_8_ = *(ulong *)(pcVar10 + lVar20 + 4);
              auVar50 = vshufps_avx(ZEXT416(*(uint *)(pcVar10 + lVar20)),auVar52,0x4c);
              local_a8 = vshufps_avx(auVar50,auVar50,0x78);
              auVar53._8_8_ = 0;
              auVar53._0_8_ = *(ulong *)(pcVar10 + lVar20 + 0x10);
              auVar50 = vshufps_avx(ZEXT416(*(uint *)(pcVar10 + lVar20 + 0xc)),auVar53,0x4c);
              local_78 = vshufps_avx(auVar50,auVar50,0x78);
              auVar54._8_8_ = 0;
              auVar54._0_8_ = *(ulong *)(pcVar10 + lVar20 + 0x1c);
              auVar50 = vshufps_avx(ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x18)),auVar54,0x4c);
              local_b8 = vshufps_avx(auVar50,auVar50,0x78);
              auVar55._8_8_ = 0;
              auVar55._0_8_ = *(ulong *)(pcVar10 + lVar20 + 0x28);
              auVar50 = vshufps_avx(ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x24)),auVar55,0x4c);
              local_68 = vshufps_avx(auVar50,auVar50,0x78);
            }
          }
          else if (RVar5 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
            pcVar10 = pRVar9->ptr_ofs;
            lVar20 = pRVar9->stride * uVar14;
            auVar56._8_8_ = 0;
            auVar56._0_8_ = *(ulong *)(pcVar10 + lVar20 + 0x10);
            auVar50 = vinsertps_avx(auVar56,ZEXT416(*(uint *)(pcVar10 + lVar20 + 8)),0x20);
            auVar70._8_8_ = 0;
            auVar70._0_8_ = *(ulong *)(pcVar10 + lVar20 + 0x34);
            auVar56 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar10 + lVar20)),auVar70);
            auVar70 = vshufps_avx(auVar56,auVar70,0xd8);
            auVar74._8_8_ = 0;
            auVar74._0_8_ = *(ulong *)(pcVar10 + lVar20 + 0x1c);
            auVar56 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x18)),auVar74);
            auVar74 = vshufps_avx(auVar56,auVar74,0xd8);
            fVar23 = *(float *)(pcVar10 + lVar20 + 0x24);
            fVar25 = *(float *)(pcVar10 + lVar20 + 0x28);
            fVar26 = *(float *)(pcVar10 + lVar20 + 0x2c);
            fVar27 = *(float *)(pcVar10 + lVar20 + 0x30);
            fVar33 = fVar27 * fVar27 + fVar26 * fVar26 + fVar23 * fVar23 + fVar25 * fVar25;
            auVar56 = vrsqrtss_avx(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33));
            fVar40 = auVar56._0_4_;
            fVar33 = fVar40 * 1.5 + fVar40 * fVar40 * fVar40 * fVar33 * -0.5;
            local_68 = vinsertps_avx(auVar74,ZEXT416((uint)(fVar23 * fVar33)),0x30);
            local_a8 = vinsertps_avx(auVar70,ZEXT416((uint)(fVar25 * fVar33)),0x30);
            auVar56 = vinsertps_avx(ZEXT416(*(uint *)(pcVar10 + lVar20 + 0xc)),
                                    ZEXT416(*(uint *)(pcVar10 + lVar20 + 4)),0x10);
            local_b8 = vinsertps_avx(auVar50,ZEXT416((uint)(fVar33 * fVar27)),0x30);
            auVar50 = vinsertps_avx(auVar56,ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x3c)),0x20);
            local_78 = vinsertps_avx(auVar50,ZEXT416((uint)(fVar26 * fVar33)),0x30);
          }
          else if (RVar5 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
            pcVar10 = pRVar9->ptr_ofs;
            lVar20 = pRVar9->stride * uVar14;
            local_a8 = *(undefined1 (*) [16])(pcVar10 + lVar20);
            local_78 = *(undefined1 (*) [16])(pcVar10 + lVar20 + 0x10);
            local_b8 = *(undefined1 (*) [16])(pcVar10 + lVar20 + 0x20);
            local_68 = *(undefined1 (*) [16])(pcVar10 + lVar20 + 0x30);
          }
          auVar50 = vshufps_avx(local_68,local_68,0xff);
          auVar56 = vshufps_avx(local_a8,local_a8,0xff);
          auVar70 = vshufps_avx(local_78,local_78,0xff);
          auVar74 = vshufps_avx(local_b8,local_b8,0xff);
          fVar43 = auVar56._0_4_;
          fVar42 = auVar50._0_4_;
          fVar69 = auVar70._0_4_;
          fVar46 = auVar74._0_4_;
          fVar23 = fVar46 * fVar42 + fVar43 * fVar69;
          fVar27 = fVar43 * fVar69 - fVar46 * fVar42;
          fVar33 = fVar42 * fVar42 - fVar43 * fVar43;
          fVar40 = fVar43 * fVar46 - fVar69 * fVar42;
          fVar25 = fVar43 * fVar46 + fVar69 * fVar42;
          fVar26 = fVar69 * fVar46 + fVar43 * fVar42;
          fVar41 = fVar69 * fVar46 - fVar43 * fVar42;
          auVar50 = ZEXT416((uint)(fVar23 + fVar23));
          auVar50 = vshufps_avx(auVar50,auVar50,0);
          auVar56 = ZEXT416((uint)(fVar40 + fVar40));
          auVar56 = vshufps_avx(auVar56,auVar56,0);
          auVar70 = vpermilps_avx(ZEXT416((uint)(-fVar46 * fVar46 +
                                                -fVar69 * fVar69 + fVar42 * fVar42 + fVar43 * fVar43
                                                )),0);
          fVar67 = auVar70._0_4_ * 1.0 + auVar50._0_4_ * 0.0 + auVar56._0_4_ * 0.0;
          fVar47 = auVar70._4_4_ * 0.0 + auVar50._4_4_ * 1.0 + auVar56._4_4_ * 0.0;
          fVar68 = auVar70._8_4_ * 0.0 + auVar50._8_4_ * 0.0 + auVar56._8_4_ * 1.0;
          fVar48 = auVar70._12_4_ * 0.0 + auVar50._12_4_ * 0.0 + auVar56._12_4_ * 0.0;
          auVar50 = ZEXT416((uint)(fVar27 + fVar27));
          auVar50 = vshufps_avx(auVar50,auVar50,0);
          auVar70 = vpermilps_avx(ZEXT416((uint)(fVar69 * fVar69 + fVar33 + -fVar46 * fVar46)),0);
          auVar56 = ZEXT416((uint)(fVar26 + fVar26));
          auVar56 = vshufps_avx(auVar56,auVar56,0);
          fVar40 = auVar50._0_4_ * 1.0 + auVar56._0_4_ * 0.0 + auVar70._0_4_ * 0.0;
          fVar42 = auVar50._4_4_ * 0.0 + auVar56._4_4_ * 0.0 + auVar70._4_4_ * 1.0;
          fVar43 = auVar50._8_4_ * 0.0 + auVar56._8_4_ * 1.0 + auVar70._8_4_ * 0.0;
          fVar66 = auVar50._12_4_ * 0.0 + auVar56._12_4_ * 0.0 + auVar70._12_4_ * 0.0;
          auVar50 = ZEXT416((uint)(fVar25 + fVar25));
          auVar50 = vshufps_avx(auVar50,auVar50,0);
          auVar56 = ZEXT416((uint)(fVar41 + fVar41));
          auVar56 = vshufps_avx(auVar56,auVar56,0);
          auVar70 = vpermilps_avx(ZEXT416((uint)(fVar46 * fVar46 + fVar33 + -fVar69 * fVar69)),0);
          fVar23 = auVar56._0_4_ * 0.0 + auVar70._0_4_ * 0.0 + auVar50._0_4_ * 1.0;
          fVar25 = auVar56._4_4_ * 1.0 + auVar70._4_4_ * 0.0 + auVar50._4_4_ * 0.0;
          fVar26 = auVar56._8_4_ * 0.0 + auVar70._8_4_ * 1.0 + auVar50._8_4_ * 0.0;
          fVar27 = auVar56._12_4_ * 0.0 + auVar70._12_4_ * 0.0 + auVar50._12_4_ * 0.0;
          auVar56 = vshufps_avx(local_a8,local_a8,0);
          auVar50._0_4_ = auVar56._0_4_ * fVar67 + fVar40 * 0.0 + fVar23 * 0.0;
          auVar50._4_4_ = auVar56._4_4_ * fVar47 + fVar42 * 0.0 + fVar25 * 0.0;
          auVar50._8_4_ = auVar56._8_4_ * fVar68 + fVar43 * 0.0 + fVar26 * 0.0;
          auVar50._12_4_ = auVar56._12_4_ * fVar48 + fVar66 * 0.0 + fVar27 * 0.0;
          auVar56 = vshufps_avx(local_78,local_78,0);
          auVar70 = vshufps_avx(local_78,local_78,0x55);
          auVar49._0_4_ = auVar56._0_4_ * fVar67 + auVar70._0_4_ * fVar40 + fVar23 * 0.0;
          auVar49._4_4_ = auVar56._4_4_ * fVar47 + auVar70._4_4_ * fVar42 + fVar25 * 0.0;
          auVar49._8_4_ = auVar56._8_4_ * fVar68 + auVar70._8_4_ * fVar43 + fVar26 * 0.0;
          auVar49._12_4_ = auVar56._12_4_ * fVar48 + auVar70._12_4_ * fVar66 + fVar27 * 0.0;
          auVar56 = vshufps_avx(local_b8,local_b8,0x55);
          auVar70 = vshufps_avx(local_b8,local_b8,0xaa);
          auVar74 = vshufps_avx(local_b8,local_b8,0);
          auVar75._0_4_ = auVar74._0_4_ * fVar67 + auVar56._0_4_ * fVar40 + auVar70._0_4_ * fVar23;
          auVar75._4_4_ = auVar74._4_4_ * fVar47 + auVar56._4_4_ * fVar42 + auVar70._4_4_ * fVar25;
          auVar75._8_4_ = auVar74._8_4_ * fVar68 + auVar56._8_4_ * fVar43 + auVar70._8_4_ * fVar26;
          auVar75._12_4_ =
               auVar74._12_4_ * fVar48 + auVar56._12_4_ * fVar66 + auVar70._12_4_ * fVar27;
          auVar70 = vshufps_avx(local_68,local_68,0xaa);
          auVar74 = vshufps_avx(local_68,local_68,0x55);
          auVar52 = vshufps_avx(local_68,local_68,0);
          auVar56 = vshufps_avx(local_a8,ZEXT816(0) << 0x20,0xe9);
          auVar56 = vblendps_avx(auVar56,local_78,4);
          auVar73._0_4_ =
               auVar56._0_4_ + 0.0 +
               auVar52._0_4_ * fVar67 + auVar74._0_4_ * fVar40 + auVar70._0_4_ * fVar23;
          auVar73._4_4_ =
               auVar56._4_4_ + 0.0 +
               auVar52._4_4_ * fVar47 + auVar74._4_4_ * fVar42 + auVar70._4_4_ * fVar25;
          auVar73._8_4_ =
               auVar56._8_4_ + 0.0 +
               auVar52._8_4_ * fVar68 + auVar74._8_4_ * fVar43 + auVar70._8_4_ * fVar26;
          auVar73._12_4_ =
               auVar56._12_4_ + 0.0 +
               auVar52._12_4_ * fVar48 + auVar74._12_4_ * fVar66 + auVar70._12_4_ * fVar27;
        }
        else {
          auVar49 = in_ZMM6._0_16_;
          auVar75 = local_108;
          auVar73 = local_f8;
          if ((int)RVar5 < 0x9244) {
            if (RVar5 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar10 = pRVar9->ptr_ofs;
              lVar20 = pRVar9->stride * uVar14;
              auVar50 = vinsertps_avx(ZEXT416(*(uint *)(pcVar10 + lVar20)),
                                      ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x10)),0x1c);
              auVar50 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x20)),0x28);
              auVar56 = vinsertps_avx(ZEXT416(*(uint *)(pcVar10 + lVar20 + 4)),
                                      ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x14)),0x1c);
              auVar49 = vinsertps_avx(auVar56,ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x24)),0x28);
              auVar56 = vinsertps_avx(ZEXT416(*(uint *)(pcVar10 + lVar20 + 8)),
                                      ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x18)),0x1c);
              auVar75 = vinsertps_avx(auVar56,ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x28)),0x28);
              auVar56 = vinsertps_avx(ZEXT416(*(uint *)(pcVar10 + lVar20 + 0xc)),
                                      ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x1c)),0x1c);
              auVar73 = vinsertps_avx(auVar56,ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x2c)),0x28);
            }
            else if (RVar5 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar10 = pRVar9->ptr_ofs;
              lVar20 = pRVar9->stride * uVar14;
              auVar34._8_8_ = 0;
              auVar34._0_8_ = *(ulong *)(pcVar10 + lVar20 + 4);
              auVar50 = vshufps_avx(ZEXT416(*(uint *)(pcVar10 + lVar20)),auVar34,0x4c);
              auVar50 = vshufps_avx(auVar50,auVar50,0x78);
              auVar35._8_8_ = 0;
              auVar35._0_8_ = *(ulong *)(pcVar10 + lVar20 + 0x10);
              auVar56 = vshufps_avx(ZEXT416(*(uint *)(pcVar10 + lVar20 + 0xc)),auVar35,0x4c);
              auVar49 = vshufps_avx(auVar56,auVar56,0x78);
              auVar36._8_8_ = 0;
              auVar36._0_8_ = *(ulong *)(pcVar10 + lVar20 + 0x1c);
              auVar56 = vshufps_avx(ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x18)),auVar36,0x4c);
              auVar75 = vshufps_avx(auVar56,auVar56,0x78);
              auVar37._8_8_ = 0;
              auVar37._0_8_ = *(ulong *)(pcVar10 + lVar20 + 0x28);
              auVar56 = vshufps_avx(ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x24)),auVar37,0x4c);
              auVar73 = vshufps_avx(auVar56,auVar56,0x78);
            }
          }
          else if (RVar5 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
            pcVar10 = pRVar9->ptr_ofs;
            lVar20 = pRVar9->stride * uVar14;
            auVar38._8_8_ = 0;
            auVar38._0_8_ = *(ulong *)(pcVar10 + lVar20 + 0x10);
            auVar56 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(pcVar10 + lVar20 + 8)),0x20);
            auVar39._8_8_ = 0;
            auVar39._0_8_ = *(ulong *)(pcVar10 + lVar20 + 0x34);
            auVar50 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar10 + lVar20)),auVar39);
            auVar70 = vshufps_avx(auVar50,auVar39,0xd8);
            auVar51._8_8_ = 0;
            auVar51._0_8_ = *(ulong *)(pcVar10 + lVar20 + 0x1c);
            auVar50 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x18)),auVar51);
            auVar74 = vshufps_avx(auVar50,auVar51,0xd8);
            fVar23 = *(float *)(pcVar10 + lVar20 + 0x24);
            fVar25 = *(float *)(pcVar10 + lVar20 + 0x28);
            fVar26 = *(float *)(pcVar10 + lVar20 + 0x2c);
            fVar27 = *(float *)(pcVar10 + lVar20 + 0x30);
            fVar33 = fVar27 * fVar27 + fVar26 * fVar26 + fVar23 * fVar23 + fVar25 * fVar25;
            auVar50 = vrsqrtss_avx(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33));
            fVar40 = auVar50._0_4_;
            fVar33 = fVar40 * 1.5 + fVar40 * fVar40 * fVar40 * fVar33 * -0.5;
            auVar73 = vinsertps_avx(auVar74,ZEXT416((uint)(fVar23 * fVar33)),0x30);
            auVar50 = vinsertps_avx(auVar70,ZEXT416((uint)(fVar25 * fVar33)),0x30);
            auVar70 = vinsertps_avx(ZEXT416(*(uint *)(pcVar10 + lVar20 + 0xc)),
                                    ZEXT416(*(uint *)(pcVar10 + lVar20 + 4)),0x10);
            auVar75 = vinsertps_avx(auVar56,ZEXT416((uint)(fVar27 * fVar33)),0x30);
            auVar56 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(pcVar10 + lVar20 + 0x3c)),0x20);
            auVar49 = vinsertps_avx(auVar56,ZEXT416((uint)(fVar26 * fVar33)),0x30);
          }
          else if (RVar5 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
            pcVar10 = pRVar9->ptr_ofs;
            lVar20 = pRVar9->stride * uVar14;
            auVar50 = *(undefined1 (*) [16])(pcVar10 + lVar20);
            auVar49 = *(undefined1 (*) [16])(pcVar10 + lVar20 + 0x10);
            auVar75 = *(undefined1 (*) [16])(pcVar10 + lVar20 + 0x20);
            auVar73 = *(undefined1 (*) [16])(pcVar10 + lVar20 + 0x30);
          }
          in_ZMM6 = ZEXT1664(auVar49);
          in_ZMM7 = ZEXT1664(auVar50);
          local_108 = auVar75;
          local_f8 = auVar73;
        }
        if (pAVar19 == (Accel *)0x0) {
          pAVar19 = pIVar8->objects
                    [*(uint *)((pIVar8->object_ids).super_RawBufferView.ptr_ofs +
                              (pIVar8->object_ids).super_RawBufferView.stride * uVar14)];
        }
        auVar70 = vminps_avx((undefined1  [16])
                             (pAVar19->super_AccelData).bounds.bounds0.lower.field_0,
                             (undefined1  [16])
                             (pAVar19->super_AccelData).bounds.bounds1.lower.field_0);
        auVar56 = vmaxps_avx((undefined1  [16])
                             (pAVar19->super_AccelData).bounds.bounds0.upper.field_0,
                             (undefined1  [16])
                             (pAVar19->super_AccelData).bounds.bounds1.upper.field_0);
        auVar74 = vshufps_avx(auVar70,auVar70,0);
        auVar52 = vshufps_avx(auVar70,auVar70,0x55);
        auVar70 = vshufps_avx(auVar70,auVar70,0xaa);
        fVar33 = auVar73._0_4_ + auVar75._0_4_ * auVar70._0_4_;
        fVar40 = auVar73._4_4_ + auVar75._4_4_ * auVar70._4_4_;
        fVar41 = auVar73._8_4_ + auVar75._8_4_ * auVar70._8_4_;
        fVar42 = auVar73._12_4_ + auVar75._12_4_ * auVar70._12_4_;
        fVar62 = auVar49._0_4_ * auVar52._0_4_;
        fVar63 = auVar49._4_4_ * auVar52._4_4_;
        fVar64 = auVar49._8_4_ * auVar52._8_4_;
        fVar65 = auVar49._12_4_ * auVar52._12_4_;
        fVar23 = fVar62 + fVar33;
        fVar25 = fVar63 + fVar40;
        fVar26 = fVar64 + fVar41;
        fVar27 = fVar65 + fVar42;
        fVar57 = auVar50._0_4_ * auVar74._0_4_;
        fVar59 = auVar50._4_4_ * auVar74._4_4_;
        fVar60 = auVar50._8_4_ * auVar74._8_4_;
        fVar61 = auVar50._12_4_ * auVar74._12_4_;
        auVar29._0_4_ = fVar57 + fVar23;
        auVar29._4_4_ = fVar59 + fVar25;
        auVar29._8_4_ = fVar60 + fVar26;
        auVar29._12_4_ = fVar61 + fVar27;
        auVar44._8_4_ = 0x7f800000;
        auVar44._0_8_ = 0x7f8000007f800000;
        auVar44._12_4_ = 0x7f800000;
        auVar74 = vminps_avx(auVar44,auVar29);
        auVar45._8_4_ = 0xff800000;
        auVar45._0_8_ = 0xff800000ff800000;
        auVar45._12_4_ = 0xff800000;
        auVar70 = vmaxps_avx(auVar45,auVar29);
        auVar52 = vshufps_avx(auVar56,auVar56,0xaa);
        fVar43 = auVar73._0_4_ + auVar75._0_4_ * auVar52._0_4_;
        fVar46 = auVar73._4_4_ + auVar75._4_4_ * auVar52._4_4_;
        fVar47 = auVar73._8_4_ + auVar75._8_4_ * auVar52._8_4_;
        fVar48 = auVar73._12_4_ + auVar75._12_4_ * auVar52._12_4_;
        fVar62 = fVar62 + fVar43;
        fVar63 = fVar63 + fVar46;
        fVar64 = fVar64 + fVar47;
        fVar65 = fVar65 + fVar48;
        auVar71._0_4_ = fVar57 + fVar62;
        auVar71._4_4_ = fVar59 + fVar63;
        auVar71._8_4_ = fVar60 + fVar64;
        auVar71._12_4_ = fVar61 + fVar65;
        auVar74 = vminps_avx(auVar74,auVar71);
        auVar70 = vmaxps_avx(auVar70,auVar71);
        auVar52 = vshufps_avx(auVar56,auVar56,0x55);
        fVar66 = auVar49._0_4_ * auVar52._0_4_;
        fVar67 = auVar49._4_4_ * auVar52._4_4_;
        fVar68 = auVar49._8_4_ * auVar52._8_4_;
        fVar69 = auVar49._12_4_ * auVar52._12_4_;
        fVar33 = fVar66 + fVar33;
        fVar40 = fVar67 + fVar40;
        fVar41 = fVar68 + fVar41;
        fVar42 = fVar69 + fVar42;
        auVar72._0_4_ = fVar57 + fVar33;
        auVar72._4_4_ = fVar59 + fVar40;
        auVar72._8_4_ = fVar60 + fVar41;
        auVar72._12_4_ = fVar61 + fVar42;
        auVar74 = vminps_avx(auVar74,auVar72);
        auVar70 = vmaxps_avx(auVar70,auVar72);
        fVar66 = fVar66 + fVar43;
        fVar67 = fVar67 + fVar46;
        fVar68 = fVar68 + fVar47;
        fVar69 = fVar69 + fVar48;
        auVar58._0_4_ = fVar57 + fVar66;
        auVar58._4_4_ = fVar59 + fVar67;
        auVar58._8_4_ = fVar60 + fVar68;
        auVar58._12_4_ = fVar61 + fVar69;
        auVar74 = vminps_avx(auVar74,auVar58);
        auVar70 = vmaxps_avx(auVar70,auVar58);
        auVar56 = vshufps_avx(auVar56,auVar56,0);
        fVar43 = auVar50._0_4_ * auVar56._0_4_;
        fVar46 = auVar50._4_4_ * auVar56._4_4_;
        fVar47 = auVar50._8_4_ * auVar56._8_4_;
        fVar48 = auVar50._12_4_ * auVar56._12_4_;
        auVar24._0_4_ = fVar43 + fVar23;
        auVar24._4_4_ = fVar46 + fVar25;
        auVar24._8_4_ = fVar47 + fVar26;
        auVar24._12_4_ = fVar48 + fVar27;
        auVar56 = vminps_avx(auVar74,auVar24);
        auVar50 = vmaxps_avx(auVar70,auVar24);
        auVar30._0_4_ = fVar43 + fVar62;
        auVar30._4_4_ = fVar46 + fVar63;
        auVar30._8_4_ = fVar47 + fVar64;
        auVar30._12_4_ = fVar48 + fVar65;
        auVar56 = vminps_avx(auVar56,auVar30);
        auVar50 = vmaxps_avx(auVar50,auVar30);
        auVar31._0_4_ = fVar43 + fVar33;
        auVar31._4_4_ = fVar46 + fVar40;
        auVar31._8_4_ = fVar47 + fVar41;
        auVar31._12_4_ = fVar48 + fVar42;
        auVar56 = vminps_avx(auVar56,auVar31);
        auVar50 = vmaxps_avx(auVar50,auVar31);
        auVar32._0_4_ = fVar43 + fVar66;
        auVar32._4_4_ = fVar46 + fVar67;
        auVar32._8_4_ = fVar47 + fVar68;
        auVar32._12_4_ = fVar48 + fVar69;
        auVar56 = vminps_avx(auVar56,auVar32);
        in_ZMM11 = ZEXT1664(auVar56);
        auVar50 = vmaxps_avx(auVar50,auVar32);
        in_ZMM12 = ZEXT1664(auVar50);
      }
      aVar21.m128 = (__m128)vminps_avx(aVar21.m128,in_ZMM11._0_16_);
      aVar28.m128 = (__m128)vmaxps_avx(aVar28.m128,in_ZMM12._0_16_);
      uVar6 = this->geomID_;
      *(uint *)(pcVar15 + lVar18 * 8) = uVar4;
      *(uint *)(pcVar15 + lVar18 * 8 + 4) = uVar6;
      lVar18 = lVar18 + 1;
    } while (uVar13 + (uVar13 == 0) != lVar18);
  }
  uVar14 = 7;
  if (uVar13 < 7) {
    uVar14 = uVar13;
  }
  (__return_storage_ptr__->ref).ptr = uVar14 | (ulong)pcVar15 | 8;
  (__return_storage_ptr__->bounds).lower.field_0 = aVar21;
  (__return_storage_ptr__->bounds).upper.field_0 = aVar28;
  return __return_storage_ptr__;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items <= 1);

        /* allocate leaf node */
        InstanceArrayPrimitive* accel = (InstanceArrayPrimitive*) alloc.malloc1(items*sizeof(InstanceArrayPrimitive),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,items);
        const InstanceArray* instance = this->mesh;

        BBox3fa bounds = empty;
        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index;
          bounds.extend(instance->bounds(primID));
          new (&accel[i]) InstanceArrayPrimitive(geomID_, primID);
        }

        BBox3fx box_o = (BBox3fx&)bounds;
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }